

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::ParseDataObjectTextureFilename(XFileParser *this,string *pName)

{
  Logger *this_00;
  long lVar1;
  ulong uVar2;
  
  readHeadOfDataObject(this,(string *)0x0);
  GetNextTokenAsString(this,pName);
  CheckForClosingBrace(this);
  if (pName->_M_string_length == 0) {
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,"Length of texture file name is zero. Skipping this texture.");
  }
  while (lVar1 = std::__cxx11::string::find((char *)pName,0x5e1e5b), lVar1 != -1) {
    uVar2 = std::__cxx11::string::find((char *)pName,0x5e1e5b);
    std::__cxx11::string::replace((ulong)pName,uVar2,(char *)0x2);
  }
  return;
}

Assistant:

void XFileParser::ParseDataObjectTextureFilename( std::string& pName)
{
    readHeadOfDataObject();
    GetNextTokenAsString( pName);
    CheckForClosingBrace();

    // FIX: some files (e.g. AnimationTest.x) have "" as texture file name
    if (!pName.length())
    {
        ASSIMP_LOG_WARN("Length of texture file name is zero. Skipping this texture.");
    }

    // some exporters write double backslash paths out. We simply replace them if we find them
    while( pName.find( "\\\\") != std::string::npos)
        pName.replace( pName.find( "\\\\"), 2, "\\");
}